

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
* toml::detail::parse_literal_string_only<toml::type_config>
            (location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  context<toml::type_config> *in_RDX;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDI;
  string_type val;
  string str;
  region reg;
  spec *spec;
  location first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe8;
  success_type *s;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  *in_stack_fffffffffffffbf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  location *in_stack_fffffffffffffc08;
  location *in_stack_fffffffffffffc10;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffc18;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  region *in_stack_fffffffffffffc48;
  spec *in_stack_fffffffffffffc68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
  *in_stack_fffffffffffffc78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffce0;
  _Alloc_hider in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b9;
  undefined1 local_288 [183];
  allocator<char> local_1d1 [17];
  string *in_stack_fffffffffffffe40;
  location *in_stack_fffffffffffffe48;
  sequence *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  
  __s = (result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
         *)in_RDI._M_current;
  location::location(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  context<toml::type_config>::toml_spec(in_RDX);
  syntax::literal_string(in_stack_fffffffffffffc68);
  sequence::scan((sequence *)in_stack_fffffffffffffce8._M_p,
                 (location *)in_stack_fffffffffffffce0._M_pi);
  sequence::~sequence((sequence *)in_stack_fffffffffffffbf0);
  bVar1 = region::is_ok((region *)0x65fa76);
  if (bVar1) {
    region::as_string_abi_cxx11_(in_stack_fffffffffffffc48);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbf0);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (this,(size_type)in_stack_fffffffffffffbf8,(size_type)in_stack_fffffffffffffbf0);
    in_stack_fffffffffffffbf0 =
         (result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
          *)local_288;
    local_2b9._9_8_ =
         CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                   (in_stack_fffffffffffffbe8);
    local_2b9._1_8_ =
         CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                   (in_stack_fffffffffffffbf8);
    __x = &local_2b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc10,in_RDI,in_stack_fffffffffffffc18,
               (allocator<char> *)in_stack_fffffffffffffc08);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
    std::make_pair<std::__cxx11::string,toml::detail::region>
              (__x,(region *)in_stack_fffffffffffffbf0);
    s = (success_type *)&stack0xfffffffffffffcb8;
    ok<std::pair<std::__cxx11::string,toml::detail::region>>(in_stack_fffffffffffffc78);
    result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
    ::result(in_stack_fffffffffffffbf0,s);
    success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>_>
    ::~success((success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>_>
                *)0x65fe0b);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
             *)in_stack_fffffffffffffbf0);
    local_288._32_4_ = 1;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbf0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbf0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc30,&__s->is_ok_,(allocator<char> *)in_RDI._M_current);
    syntax::literal_string(in_stack_fffffffffffffc68);
    location::location(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc30,&__s->is_ok_,(allocator<char> *)in_RDI._M_current);
    make_syntax_error<toml::detail::sequence>
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               in_stack_fffffffffffffe40);
    err<toml::error_info>((error_info *)in_stack_fffffffffffffc48);
    result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
    ::result(in_stack_fffffffffffffbf0,(failure_type *)in_stack_fffffffffffffbe8);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x65fb6d);
    error_info::~error_info((error_info *)in_stack_fffffffffffffbf0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbf0);
    std::allocator<char>::~allocator((allocator<char> *)(local_288 + 0x27));
    location::~location((location *)in_stack_fffffffffffffbf0);
    sequence::~sequence((sequence *)in_stack_fffffffffffffbf0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbf0);
    std::allocator<char>::~allocator(local_1d1);
    local_288._32_4_ = 1;
  }
  region::~region((region *)in_stack_fffffffffffffbf0);
  location::~location((location *)in_stack_fffffffffffffbf0);
  return __s;
}

Assistant:

result<std::pair<typename basic_value<TC>::string_type, region>, error_info>
parse_literal_string_only(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    auto reg = syntax::literal_string(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_literal_string: "
            "invalid string format",
            syntax::literal_string(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value

    auto str = reg.as_string();

    assert(str.back() == '\'');
    str.pop_back();
    assert(str.at(0) == '\'');
    str.erase(0, 1);

    using string_type = typename basic_value<TC>::string_type;
    string_type val(str.begin(), str.end());

    return ok(std::make_pair(std::move(val), std::move(reg)));
}